

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall
ON_SerialNumberMap::Internal_HashTableRemoveElement
          (ON_SerialNumberMap *this,SN_ELEMENT *e,bool bRemoveFromHashBlock)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ON__UINT32 OVar3;
  SN_ELEMENT **ppSVar4;
  SN_ELEMENT *local_48;
  SN_ELEMENT *h;
  SN_ELEMENT *prev;
  ON__UINT32 hash_i;
  SN_ELEMENT **hash_table_block;
  bool bRemoveFromHashBlock_local;
  SN_ELEMENT *e_local;
  ON_SerialNumberMap *this_local;
  
  if ((e == (SN_ELEMENT *)0x0) || (e->m_id_active == '\0')) {
    this_local = (ON_SerialNumberMap *)0x0;
  }
  else {
    e->m_id_active = '\0';
    if (this->m_active_id_count == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                 ,0x444,"","ON_SerialNumberMap - m_active_id_count corruption");
      (this->m_inactive_id).Data1 = 0;
      (this->m_inactive_id).Data2 = 0;
      (this->m_inactive_id).Data3 = 0;
      (this->m_inactive_id).Data4[0] = '\0';
      (this->m_inactive_id).Data4[1] = '\0';
      (this->m_inactive_id).Data4[2] = '\0';
      (this->m_inactive_id).Data4[3] = '\0';
      (this->m_inactive_id).Data4[4] = '\0';
      (this->m_inactive_id).Data4[5] = '\0';
      (this->m_inactive_id).Data4[6] = '\0';
      (this->m_inactive_id).Data4[7] = '\0';
    }
    else {
      this->m_active_id_count = this->m_active_id_count - 1;
      uVar1 = (e->m_id).Data2;
      uVar2 = (e->m_id).Data3;
      (this->m_inactive_id).Data1 = (e->m_id).Data1;
      (this->m_inactive_id).Data2 = uVar1;
      (this->m_inactive_id).Data3 = uVar2;
      *(undefined8 *)(this->m_inactive_id).Data4 = *(undefined8 *)(e->m_id).Data4;
    }
    if ((this->m_bHashTableIsValid != '\0') && (bRemoveFromHashBlock)) {
      ppSVar4 = Internal_HashTableBlock(this,e->m_id_crc32);
      OVar3 = Internal_HashTableBlockRowIndex(e->m_id_crc32);
      h = (SN_ELEMENT *)0x0;
      for (local_48 = ppSVar4[OVar3]; local_48 != (SN_ELEMENT *)0x0; local_48 = local_48->m_next) {
        if (local_48 == e) {
          if (h == (SN_ELEMENT *)0x0) {
            ppSVar4[OVar3] = local_48->m_next;
          }
          else {
            h->m_next = local_48->m_next;
          }
          break;
        }
        h = local_48;
      }
      if (local_48 == (SN_ELEMENT *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                   ,0x45d,"","id not found in hash table.");
      }
    }
    e->m_next = (SN_ELEMENT *)0x0;
    this_local = (ON_SerialNumberMap *)e;
  }
  return (SN_ELEMENT *)this_local;
}

Assistant:

ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::Internal_HashTableRemoveElement(
  struct SN_ELEMENT* e,
  bool bRemoveFromHashBlock
  )
{
  if ( nullptr == e || 0 == e->m_id_active )
    return nullptr;

  e->m_id_active = 0;
  if ( m_active_id_count > 0 )
  {
    m_active_id_count--;
    // save this id.  When objects are replaced, this id will
    // be added back and saving it in m_inactive_id will 
    // prevent having to check for it in the hash table.
    m_inactive_id = e->m_id;
  }
  else
  {
    ON_ERROR("ON_SerialNumberMap - m_active_id_count corruption");
    m_inactive_id = ON_nil_uuid;
  }

  if ( m_bHashTableIsValid && bRemoveFromHashBlock )
  {
    // Hash table is valid - remove the element from the table
    struct SN_ELEMENT** hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
    const ON__UINT32 hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32);
    struct SN_ELEMENT* prev = nullptr;
    struct SN_ELEMENT* h;
    for ( h = hash_table_block[hash_i]; h; h = h->m_next )
    {
      if (h == e)
      {
        if ( prev )
          prev->m_next = h->m_next;
        else
          hash_table_block[hash_i] = h->m_next;
        break;
      }
      prev = h;
    }
    if (nullptr == h)
    {
      ON_ERROR("id not found in hash table.");
    }
  }

  e->m_next = nullptr;
  return e;
}